

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

dev_t archive_entry_rdevmajor(archive_entry *entry)

{
  uint uVar1;
  
  if ((entry->ae_set & L'\x2000') == L'\0') {
    return 0;
  }
  if ((entry->ae_stat).aest_rdev_is_broken_down != L'\0') {
    return (entry->ae_stat).aest_rdevmajor;
  }
  uVar1 = gnu_dev_major((entry->ae_stat).aest_rdev);
  return (ulong)uVar1;
}

Assistant:

__LA_DEV_T
archive_entry_rdevmajor(struct archive_entry *entry)
{
	if (archive_entry_rdev_is_set(entry)) {
		if (entry->ae_stat.aest_rdev_is_broken_down)
			return (entry->ae_stat.aest_rdevmajor);
		else
			return major(entry->ae_stat.aest_rdev);
	} else {
		return 0;
	}
}